

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.cpp
# Opt level: O2

void __thiscall polyscope::showDelayedWarnings(polyscope *this)

{
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  *this_00;
  WarningMessage *pWVar1;
  bool bVar2;
  size_type sVar3;
  ostream *poVar4;
  WarningMessage *pWVar5;
  type func;
  function<void_()> local_a0;
  _Bind<void_(*(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int))(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int)>
  local_80;
  
  if ((anonymous_namespace)::showingWarning == '\0') {
    this_00 = &local_80._M_bound_args;
    while( true ) {
      sVar3 = std::
              deque<polyscope::(anonymous_namespace)::WarningMessage,_std::allocator<polyscope::(anonymous_namespace)::WarningMessage>_>
              ::size((deque<polyscope::(anonymous_namespace)::WarningMessage,_std::allocator<polyscope::(anonymous_namespace)::WarningMessage>_>
                      *)this);
      pWVar1 = DAT_00483940;
      if (sVar3 == 0) break;
      (anonymous_namespace)::showingWarning = 1;
      if (0 < options::verbosity) {
        poVar4 = std::operator<<((ostream *)&std::cout,(string *)options::printPrefix_abi_cxx11_);
        poVar4 = std::operator<<(poVar4,"[WARNING] ");
        std::operator<<(poVar4,(string *)pWVar1);
        bVar2 = std::operator!=(&pWVar1->detailMessage,"");
        if (bVar2) {
          poVar4 = std::operator<<((ostream *)&std::cout," --- ");
          std::operator<<(poVar4,(string *)&pWVar1->detailMessage);
        }
        if (0 < pWVar1->repeatCount) {
          poVar4 = std::operator<<((ostream *)&std::cout," (and ");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,pWVar1->repeatCount);
          std::operator<<(poVar4," similar messages).");
        }
        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      }
      local_80._M_f = anon_unknown_1::buildWarningUI;
      std::_Tuple_impl<0ul,std::__cxx11::string,std::__cxx11::string,int>::
      _Tuple_impl<std::__cxx11::string&,std::__cxx11::string&,int&,void>
                ((_Tuple_impl<0ul,std::__cxx11::string,std::__cxx11::string,int> *)this_00,
                 &pWVar1->baseMessage,&pWVar1->detailMessage,&pWVar1->repeatCount);
      std::function<void()>::
      function<std::_Bind<void(*(std::__cxx11::string,std::__cxx11::string,int))(std::__cxx11::string,std::__cxx11::string,int)>&,void>
                ((function<void()> *)&local_a0,&local_80);
      pushContext(&local_a0,false);
      std::_Function_base::~_Function_base(&local_a0.super__Function_base);
      pWVar1 = DAT_00483940;
      pWVar5 = DAT_00483950 + -1;
      anon_unknown_1::WarningMessage::~WarningMessage(DAT_00483940);
      if (pWVar1 == pWVar5) {
        operator_delete(DAT_00483948);
        DAT_00483940 = *(WarningMessage **)(DAT_00483958 + 8);
        DAT_00483950 = DAT_00483940 + 7;
        DAT_00483948 = DAT_00483940;
        DAT_00483958 = DAT_00483958 + 8;
      }
      else {
        DAT_00483940 = DAT_00483940 + 1;
      }
      (anonymous_namespace)::showingWarning = '\0';
      this = (polyscope *)this_00;
      std::
      _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
      ::~_Tuple_impl(&this_00->
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                    );
    }
  }
  return;
}

Assistant:

void showDelayedWarnings() {

  if (showingWarning) {
    return;
  }

  while (warningMessages.size() > 0) {
    showingWarning = true;
    WarningMessage& currMessage = warningMessages.front();

    if (options::verbosity > 0) {
      std::cout << options::printPrefix << "[WARNING] " << currMessage.baseMessage;
      if (currMessage.detailMessage != "") std::cout << " --- " << currMessage.detailMessage;
      if (currMessage.repeatCount > 0) std::cout << " (and " << currMessage.repeatCount << " similar messages).";
      std::cout << std ::endl;
    }

    auto func = std::bind(buildWarningUI, currMessage.baseMessage, currMessage.detailMessage, currMessage.repeatCount);
    pushContext(func, false);

    warningMessages.pop_front();
    showingWarning = false;
  }
}